

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  seq_t sequence;
  ZSTD_seqSymbol *pZVar5;
  ZSTD_DCtx *pZVar6;
  uint uVar7;
  int iVar8;
  BYTE *op_2;
  size_t sVar9;
  size_t sVar10;
  BYTE *pBVar11;
  ulong uVar12;
  BYTE *pBVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  long lVar17;
  BYTE *oend_00;
  BYTE *pBVar18;
  BYTE *oend;
  ulong *seqStart;
  BYTE *pBVar19;
  int iVar20;
  ulong uVar21;
  BYTE *pBVar22;
  BYTE *op;
  size_t __n;
  ulong uVar23;
  size_t srcSize_00;
  BYTE *ip_1;
  BYTE *litLimit;
  bool bVar24;
  BYTE *ostart;
  int nbSeq;
  BYTE *litPtr;
  ZSTD_longOffset_e in_stack_fffffffffffffe88;
  int local_124;
  BYTE *local_120;
  ZSTD_DCtx *local_118;
  BYTE *local_110;
  BIT_DStream_t local_108;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ZSTD_fseState local_c0;
  ulong local_b0 [6];
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  local_118 = dctx;
  sVar9 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  srcSize_00 = srcSize - sVar9;
  sVar10 = ZSTD_decodeSeqHeaders(local_118,&local_124,(void *)((long)src + sVar9),srcSize_00);
  pZVar6 = local_118;
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  seqStart = (ulong *)((long)((long)src + sVar9) + sVar10);
  sVar9 = srcSize_00 - sVar10;
  if (frame == 0) {
    if (local_124 < 1) goto LAB_00159164;
  }
  else if ((local_118->fParams).windowSize < 0x1000001 || local_124 < 1) goto LAB_00159164;
  iVar20 = 0;
  uVar16 = 1;
  do {
    iVar20 = (iVar20 + 1) -
             (uint)(local_118->OFTptr[(ulong)(uVar16 - 1) + 1].nbAdditionalBits < 0x17);
    bVar15 = (byte)local_118->OFTptr->baseValue;
    uVar7 = uVar16 >> (bVar15 & 0x1f);
    uVar16 = uVar16 + 1;
  } while (uVar7 == 0);
  if (6 < (uint)(iVar20 << (8 - bVar15 & 0x1f))) {
    sVar9 = ZSTD_decompressSequencesLong
                      (local_118,dst,dstCapacity,seqStart,sVar9,local_124,in_stack_fffffffffffffe88)
    ;
    return sVar9;
  }
LAB_00159164:
  if (local_118->bmi2 == 0) {
    oend_00 = (BYTE *)(dstCapacity + (long)dst);
    local_110 = local_118->litPtr;
    litLimit = local_110 + local_118->litSize;
    op = (BYTE *)dst;
    if (local_124 == 0) {
LAB_00159939:
      uVar14 = (long)litLimit - (long)local_110;
      pBVar11 = (BYTE *)0xffffffffffffffba;
      if (uVar14 <= (ulong)((long)oend_00 - (long)op)) {
        memcpy(op,local_110,uVar14);
        pBVar11 = op + (uVar14 - (long)dst);
      }
    }
    else {
      local_120 = (BYTE *)local_118->base;
      local_70 = (BYTE *)local_118->vBase;
      local_78 = (BYTE *)local_118->dictEnd;
      local_118->fseEntropy = 1;
      lVar17 = -0xc;
      do {
        *(ulong *)((long)local_b0 + lVar17 * 2 + 0x18) =
             (ulong)*(uint *)((long)&local_118->previousDstEnd + lVar17);
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0);
      pBVar11 = (BYTE *)0xffffffffffffffec;
      if (srcSize_00 != sVar10) {
        local_108.limitPtr = (char *)(seqStart + 1);
        if (sVar9 < 8) {
          local_108.bitContainer = (size_t)(byte)*seqStart;
          switch(sVar9) {
          case 7:
            local_108.bitContainer =
                 local_108.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
          case 6:
            local_108.bitContainer =
                 local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
          case 5:
            local_108.bitContainer =
                 local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
          case 4:
            local_108.bitContainer =
                 local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
          case 3:
            local_108.bitContainer =
                 local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
          case 2:
            local_108.bitContainer =
                 (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_108.bitContainer;
          }
          bVar15 = *(byte *)((long)src + (srcSize - 1));
          if (bVar15 == 0) {
            return 0xffffffffffffffec;
          }
          uVar16 = 0x1f;
          if (bVar15 != 0) {
            for (; bVar15 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          local_108.bitsConsumed = (uVar16 ^ 0x1f) + (int)sVar9 * -8 + 0x29;
          local_108.ptr = (char *)seqStart;
        }
        else {
          local_108.ptr = (char *)((long)src + (srcSize - 8));
          local_108.bitContainer = *(size_t *)local_108.ptr;
          if (local_108.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffec;
          }
          uVar16 = 0x1f;
          bVar15 = (byte)(local_108.bitContainer >> 0x38);
          if (bVar15 != 0) {
            for (; bVar15 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          local_108.bitsConsumed = ~uVar16 + 9;
          if (0xffffffffffffff88 < sVar9) {
            return 0xffffffffffffffec;
          }
        }
        local_108.start = (char *)seqStart;
        ZSTD_initFseState(&local_e0,&local_108,local_118->LLTptr);
        ZSTD_initFseState(&local_d0,&local_108,pZVar6->OFTptr);
        ZSTD_initFseState(&local_c0,&local_108,pZVar6->MLTptr);
        local_80 = oend_00 + -8;
        local_68 = oend_00 + -0xd;
        iVar20 = local_124;
        do {
          uVar14 = local_b0[1];
          uVar12 = (ulong)local_108.bitsConsumed;
          if (0x40 < uVar12) {
            if (iVar20 != 0) {
              return 0xffffffffffffffec;
            }
LAB_00159911:
            lVar17 = 0;
            do {
              (local_118->entropy).rep[lVar17] = (U32)local_b0[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            goto LAB_00159939;
          }
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr != local_108.start) {
              uVar16 = (int)local_108.ptr - (int)local_108.start;
              if (local_108.start <=
                  (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                uVar16 = local_108.bitsConsumed >> 3;
              }
              local_108.bitsConsumed = local_108.bitsConsumed + uVar16 * -8;
              goto LAB_00159418;
            }
          }
          else {
            uVar16 = local_108.bitsConsumed >> 3;
            local_108.bitsConsumed = local_108.bitsConsumed & 7;
LAB_00159418:
            local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar16);
            uVar12 = (ulong)local_108.bitsConsumed;
            local_108.bitContainer = *(size_t *)local_108.ptr;
          }
          bVar24 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if (bVar24) goto LAB_00159911;
          bVar15 = local_e0.table[local_e0.state].nbAdditionalBits;
          bVar2 = local_c0.table[local_c0.state].nbAdditionalBits;
          bVar3 = local_d0.table[local_d0.state].nbAdditionalBits;
          local_58 = (ulong)local_e0.table[local_e0.state].baseValue;
          local_60 = (ulong)local_c0.table[local_c0.state].baseValue;
          uVar16 = (uint)bVar3;
          if (bVar3 == 0) {
            uVar21 = 0;
LAB_001594c2:
            lVar17 = (local_58 == 0) + uVar21;
            if (lVar17 != 0) {
              if (lVar17 == 3) {
                uVar21 = (local_b0[0] - 1) + (ulong)(local_b0[0] == 1);
LAB_0015950b:
                local_b0[2] = local_b0[1];
              }
              else {
                uVar21 = local_b0[lVar17] + (ulong)(local_b0[lVar17] == 0);
                if (lVar17 != 1) goto LAB_0015950b;
              }
              local_b0[1] = local_b0[0];
              goto LAB_0015952b;
            }
          }
          else {
            uVar21 = ((local_108.bitContainer << ((byte)uVar12 & 0x3f)) >> (-bVar3 & 0x3f)) +
                     (ulong)local_d0.table[local_d0.state].baseValue;
            uVar12 = (ulong)((int)uVar12 + uVar16);
            if (uVar16 == 1) goto LAB_001594c2;
            local_b0[1] = local_b0[0];
            local_b0[2] = uVar14;
LAB_0015952b:
            local_b0[1] = local_b0[0];
            local_b0[0] = uVar21;
          }
          uVar14 = local_b0[0];
          if (bVar2 == 0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (local_108.bitContainer << ((byte)uVar12 & 0x3f)) >> (-bVar2 & 0x3f);
            uVar12 = (ulong)((int)uVar12 + (uint)bVar2);
          }
          uVar7 = (uint)uVar12;
          if ((0x1e < (uint)bVar2 + (uint)bVar15 + uVar16) && (uVar7 < 0x41)) {
            if (local_108.ptr < local_108.limitPtr) {
              if (local_108.ptr == local_108.start) goto LAB_001595c4;
              uVar23 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
              if (local_108.start <= (ulong *)((long)local_108.ptr - (uVar12 >> 3))) {
                uVar23 = uVar12 >> 3;
              }
              uVar7 = uVar7 + (int)uVar23 * -8;
            }
            else {
              uVar23 = uVar12 >> 3;
              uVar7 = uVar7 & 7;
            }
            local_108.ptr = (char *)((long)local_108.ptr - uVar23);
            local_108.bitContainer = *(size_t *)local_108.ptr;
          }
LAB_001595c4:
          if (bVar15 == 0) {
            local_50 = 0;
          }
          else {
            local_50 = (local_108.bitContainer << ((byte)uVar7 & 0x3f)) >> (-bVar15 & 0x3f);
            uVar7 = uVar7 + bVar15;
          }
          __n = uVar21 + local_c0.table[local_c0.state].baseValue;
          pZVar5 = local_e0.table + local_e0.state;
          local_e0.state =
               (((local_108.bitContainer << ((byte)uVar7 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_e0.table[local_e0.state].nextState;
          iVar8 = uVar7 + pZVar5->nbBits;
          pZVar5 = local_c0.table + local_c0.state;
          local_c0.state =
               (((local_108.bitContainer << ((byte)iVar8 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_c0.table[local_c0.state].nextState;
          iVar8 = iVar8 + (uint)pZVar5->nbBits;
          pZVar5 = local_d0.table + local_d0.state;
          local_50 = local_50 + local_58;
          local_d0.state =
               (((local_108.bitContainer << ((byte)iVar8 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_d0.table[local_d0.state].nextState;
          local_108.bitsConsumed = iVar8 + (uint)pZVar5->nbBits;
          sStack_48 = __n;
          local_40 = local_b0[0];
          pBVar11 = (BYTE *)(local_50 + __n);
          pBVar1 = op + (long)pBVar11;
          if (oend_00 < pBVar1) {
            return 0xffffffffffffffba;
          }
          pBVar13 = local_110 + local_50;
          if (litLimit < pBVar13) {
            return 0xffffffffffffffec;
          }
          pBVar19 = op + local_50;
          if (local_80 < pBVar19) {
            sequence.matchLength = __n;
            sequence.litLength = local_50;
            sequence.offset = local_b0[0];
            sequence.match = pBStack_38;
            pBVar11 = (BYTE *)ZSTD_execSequenceLast7
                                        (op,oend_00,sequence,&local_110,litLimit,local_120,local_70,
                                         local_78);
          }
          else {
            *(undefined8 *)op = *(undefined8 *)local_110;
            if (8 < local_50) {
              pBVar22 = op + 8;
              do {
                local_110 = local_110 + 8;
                *(undefined8 *)pBVar22 = *(undefined8 *)local_110;
                pBVar22 = pBVar22 + 8;
              } while (pBVar22 < pBVar19);
            }
            pBVar22 = pBVar19 + -local_b0[0];
            local_110 = pBVar13;
            if ((ulong)((long)pBVar19 - (long)local_120) < local_b0[0]) {
              if ((ulong)((long)pBVar19 - (long)local_70) < local_b0[0]) {
                return 0xffffffffffffffec;
              }
              lVar17 = (long)(pBVar19 + -local_b0[0]) - (long)local_120;
              pBVar13 = local_78 + lVar17;
              if (local_78 < pBVar13 + __n) {
                memmove(pBVar19,pBVar13,-lVar17);
                pBVar19 = pBVar19 + -lVar17;
                sStack_48 = __n + lVar17;
                if ((pBVar19 <= local_80) && (pBVar22 = local_120, 2 < sStack_48))
                goto LAB_001597e3;
                if (sStack_48 != 0) {
                  uVar14 = 0;
                  do {
                    pBVar19[uVar14] = local_120[uVar14];
                    uVar14 = uVar14 + 1;
                  } while ((uVar14 & 0xffffffff) < sStack_48);
                }
              }
              else {
                memmove(pBVar19,pBVar13,__n);
              }
            }
            else {
LAB_001597e3:
              if (uVar14 < 8) {
                iVar8 = *(int *)(ZSTD_execSequence_dec64table + uVar14 * 4);
                *pBVar19 = *pBVar22;
                pBVar19[1] = pBVar22[1];
                pBVar19[2] = pBVar22[2];
                pBVar19[3] = pBVar22[3];
                pBVar13 = pBVar22 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
                pBVar22 = pBVar22 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_40 * 4) -
                                    (long)iVar8);
                *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)pBVar13;
              }
              else {
                *(undefined8 *)pBVar19 = *(undefined8 *)pBVar22;
              }
              pBVar13 = pBVar19 + 8;
              pBVar22 = pBVar22 + 8;
              if (local_68 < pBVar1) {
                pBVar19 = pBVar13;
                pBVar18 = pBVar22;
                if (pBVar13 < local_80) {
                  do {
                    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar18;
                    pBVar19 = pBVar19 + 8;
                    pBVar18 = pBVar18 + 8;
                  } while (pBVar19 < local_80);
                  pBVar22 = pBVar22 + ((long)local_80 - (long)pBVar13);
                  pBVar13 = local_80;
                }
                for (; pBVar13 < pBVar1; pBVar13 = pBVar13 + 1) {
                  BVar4 = *pBVar22;
                  pBVar22 = pBVar22 + 1;
                  *pBVar13 = BVar4;
                }
              }
              else {
                do {
                  *(undefined8 *)pBVar13 = *(undefined8 *)pBVar22;
                  pBVar13 = pBVar13 + 8;
                  pBVar22 = pBVar22 + 8;
                } while (pBVar13 < pBVar19 + sStack_48);
              }
            }
          }
          op = op + (long)pBVar11;
        } while (pBVar11 < (BYTE *)0xffffffffffffff89);
      }
    }
  }
  else {
    pBVar11 = (BYTE *)ZSTD_decompressSequences_bmi2
                                (local_118,dst,dstCapacity,seqStart,sVar9,local_124,
                                 in_stack_fffffffffffffe88);
  }
  return (size_t)pBVar11;
}

Assistant:

static size_t ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative. (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN)));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {   int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        if ( (!frame || dctx->fParams.windowSize > (1<<24))
          && (nbSeq>0) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            if (shareLongOffsets >= minShare)
                return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
        }

        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
    }
}